

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement<char_const(&)[16],std::__cxx11::string,char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
          (CompilerGLSL *this,char (*ts) [16],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,char (*ts_2) [21],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,char (*ts_4) [2])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  uint local_5c;
  spirv_cross local_58 [4];
  uint32_t i;
  char (*local_38) [2];
  char (*ts_local_4) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_3;
  char (*ts_local_2) [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_1;
  char (*ts_local) [16];
  CompilerGLSL *this_local;
  
  local_38 = ts_4;
  ts_local_4 = (char (*) [2])ts_3;
  ts_local_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2;
  ts_local_2 = (char (*) [21])ts_1;
  ts_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts;
  ts_local = (char (*) [16])this;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar1) {
    this->statement_count = this->statement_count + 1;
  }
  else if (this->redirect_statement ==
           (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *)0x0) {
    for (local_5c = 0; local_5c < this->indent; local_5c = local_5c + 1) {
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
    }
    statement_inner<char_const(&)[16],std::__cxx11::string,char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
              (this,(char (*) [16])ts_local_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_2,
               (char (*) [21])ts_local_3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_4,
               local_38);
    StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
  }
  else {
    this_00 = this->redirect_statement;
    join<char_const(&)[16],std::__cxx11::string,char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
              (local_58,(char (*) [16])ts_local_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_2,
               (char (*) [21])ts_local_3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_4,
               local_38);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58);
    ::std::__cxx11::string::~string((string *)local_58);
    this->statement_count = this->statement_count + 1;
  }
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}